

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexReader::getData(PtexReader *this,int faceid,void *buffer,int stride,Res res)

{
  uint uVar1;
  int iVar2;
  PtexFaceData *pPVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint in_ECX;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  Res in_R8W;
  PtexPtr<Ptex::v2_2::PtexFaceData> t;
  int j;
  char *dsttile;
  int i;
  char *dsttilerow;
  int tile;
  int tilerowlen;
  int tilevres;
  int tileures;
  int ntilesv;
  int ntilesu;
  Res tileres;
  PtexPtr<Ptex::v2_2::PtexFaceData> d;
  int rowlen;
  int resv;
  int resu;
  EVP_PKEY_CTX *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  EVP_PKEY_CTX *in_stack_fffffffffffffeb0;
  PtexFaceData *in_stack_fffffffffffffeb8;
  void *in_stack_fffffffffffffec0;
  PtexPtr<Ptex::v2_2::PtexFaceData> local_98;
  int local_8c;
  long local_88;
  int local_7c;
  long local_78;
  int local_70;
  uint local_6c;
  int local_68;
  int local_64;
  Res local_5e;
  int local_5c;
  Res local_56;
  int local_54;
  Res local_4e [10];
  Res local_3a;
  PtexPtr<Ptex::v2_2::PtexFaceData> local_38;
  uint local_30;
  int local_2c;
  int local_28;
  uint local_24;
  long local_20;
  int local_14;
  Res local_2;
  
  if ((((*(byte *)((long)in_RDI + 0x51) & 1) == 0) || (in_ESI < 0)) ||
     ((ulong)*(uint *)(in_RDI + 0x14) <= (ulong)(long)in_ESI)) {
    std::vector<char,_std::allocator<char>_>::operator[]
              ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x44),0);
    Res::u(&local_2);
    Res::v(&local_2);
    PtexUtils::fill(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                    (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),(int)in_stack_fffffffffffffeb0,
                    (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(int)in_stack_fffffffffffffea8);
  }
  else {
    local_24 = in_ECX;
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_2 = in_R8W;
    local_28 = Res::u(&local_2);
    local_2c = Res::v(&local_2);
    local_30 = (int)in_RDI[0x26] * local_28;
    if (local_24 == 0) {
      local_24 = local_30;
    }
    local_3a = local_2;
    pPVar3 = (PtexFaceData *)(**(code **)(*in_RDI + 0xa0))(in_RDI,local_14,local_2);
    PtexPtr<Ptex::v2_2::PtexFaceData>::PtexPtr(&local_38,pPVar3);
    pPVar3 = PtexPtr<Ptex::v2_2::PtexFaceData>::operator->(&local_38);
    uVar1 = (*pPVar3->_vptr_PtexFaceData[3])();
    if ((uVar1 & 1) == 0) {
      pPVar3 = PtexPtr<Ptex::v2_2::PtexFaceData>::operator->(&local_38);
      uVar1 = (*pPVar3->_vptr_PtexFaceData[7])();
      if ((uVar1 & 1) == 0) {
        pPVar3 = PtexPtr<Ptex::v2_2::PtexFaceData>::operator->(&local_38);
        iVar2 = (*pPVar3->_vptr_PtexFaceData[6])();
        in_stack_fffffffffffffea0 = (EVP_PKEY_CTX *)CONCAT44(extraout_var_02,iVar2);
        PtexUtils::copy(in_stack_fffffffffffffea0,(EVP_PKEY_CTX *)(ulong)local_30);
      }
      else {
        pPVar3 = PtexPtr<Ptex::v2_2::PtexFaceData>::operator->(&local_38);
        iVar2 = (*pPVar3->_vptr_PtexFaceData[8])();
        local_56 = SUB42(iVar2,0);
        local_4e[0] = local_56;
        local_54 = Res::ntilesu(&local_2,local_56);
        local_5e = local_4e[0];
        local_5c = Res::ntilesv(&local_2,local_4e[0]);
        local_64 = Res::u(local_4e);
        local_68 = Res::v(local_4e);
        local_6c = (int)in_RDI[0x26] * local_64;
        local_70 = 0;
        local_78 = local_20;
        for (local_7c = 0; local_7c < local_5c; local_7c = local_7c + 1) {
          local_88 = local_78;
          for (local_8c = 0; local_8c < local_54; local_8c = local_8c + 1) {
            pPVar3 = PtexPtr<Ptex::v2_2::PtexFaceData>::operator->(&local_38);
            local_70 = local_70 + 1;
            iVar2 = (*pPVar3->_vptr_PtexFaceData[9])();
            PtexPtr<Ptex::v2_2::PtexFaceData>::PtexPtr
                      (&local_98,(PtexFaceData *)CONCAT44(extraout_var,iVar2));
            pPVar3 = PtexPtr<Ptex::v2_2::PtexFaceData>::operator->(&local_98);
            uVar1 = (*pPVar3->_vptr_PtexFaceData[3])();
            if ((uVar1 & 1) == 0) {
              in_stack_fffffffffffffeb8 = PtexPtr<Ptex::v2_2::PtexFaceData>::operator->(&local_98);
              iVar2 = (*in_stack_fffffffffffffeb8->_vptr_PtexFaceData[6])();
              in_stack_fffffffffffffeb0 = (EVP_PKEY_CTX *)CONCAT44(extraout_var_01,iVar2);
              PtexUtils::copy(in_stack_fffffffffffffeb0,(EVP_PKEY_CTX *)(ulong)local_6c);
            }
            else {
              pPVar3 = PtexPtr<Ptex::v2_2::PtexFaceData>::operator->(&local_98);
              iVar2 = (*pPVar3->_vptr_PtexFaceData[6])();
              PtexUtils::fill((void *)CONCAT44(extraout_var_00,iVar2),in_stack_fffffffffffffeb8,
                              (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                              (int)in_stack_fffffffffffffeb0,
                              (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                              (int)in_stack_fffffffffffffea8);
            }
            local_88 = local_88 + (int)local_6c;
            PtexPtr<Ptex::v2_2::PtexFaceData>::~PtexPtr
                      ((PtexPtr<Ptex::v2_2::PtexFaceData> *)in_stack_fffffffffffffea0);
          }
          local_78 = local_78 + (int)(local_24 * local_68);
        }
      }
    }
    else {
      pPVar3 = PtexPtr<Ptex::v2_2::PtexFaceData>::operator->(&local_38);
      (*pPVar3->_vptr_PtexFaceData[6])();
      PtexUtils::fill(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                      (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),(int)in_stack_fffffffffffffeb0
                      ,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                      (int)in_stack_fffffffffffffea8);
    }
    PtexPtr<Ptex::v2_2::PtexFaceData>::~PtexPtr
              ((PtexPtr<Ptex::v2_2::PtexFaceData> *)in_stack_fffffffffffffea0);
  }
  return;
}

Assistant:

void PtexReader::getData(int faceid, void* buffer, int stride, Res res)
{
    if (!_ok || faceid < 0 || size_t(faceid) >= _header.nfaces) {
        PtexUtils::fill(&_errorPixel[0], buffer, stride, res.u(), res.v(), _pixelsize);
        return;
    }

    // note - all locking is handled in called getData methods
    int resu = res.u(), resv = res.v();
    int rowlen = _pixelsize * resu;
    if (stride == 0) stride = rowlen;

    PtexPtr<PtexFaceData> d ( getData(faceid, res) );
    if (d->isConstant()) {
        // fill dest buffer with pixel value
        PtexUtils::fill(d->getData(), buffer, stride,
                        resu, resv, _pixelsize);
    }
    else if (d->isTiled()) {
        // loop over tiles
        Res tileres = d->tileRes();
        int ntilesu = res.ntilesu(tileres);
        int ntilesv = res.ntilesv(tileres);
        int tileures = tileres.u();
        int tilevres = tileres.v();
        int tilerowlen = _pixelsize * tileures;
        int tile = 0;
        char* dsttilerow = (char*) buffer;
        for (int i = 0; i < ntilesv; i++) {
            char* dsttile = dsttilerow;
            for (int j = 0; j < ntilesu; j++) {
                PtexPtr<PtexFaceData> t ( d->getTile(tile++) );
                if (t->isConstant())
                    PtexUtils::fill(t->getData(), dsttile, stride,
                                    tileures, tilevres, _pixelsize);
                else
                    PtexUtils::copy(t->getData(), tilerowlen, dsttile, stride,
                                    tilevres, tilerowlen);
                dsttile += tilerowlen;
            }
            dsttilerow += stride * tilevres;
        }
    }
    else {
        PtexUtils::copy(d->getData(), rowlen, buffer, stride, resv, rowlen);
    }
}